

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

void __thiscall
duckdb::WindowLocalSourceState::GetData(WindowLocalSourceState *this,DataChunk *result)

{
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
  *this_00;
  DataChunk *this_01;
  TaskPtr *this_02;
  DataChunk *this_03;
  idx_t *piVar1;
  DataChunk *this_04;
  WindowHashGroup *pWVar2;
  idx_t iVar3;
  WindowGlobalSinkState *pWVar4;
  WindowHashGroup *pWVar5;
  pointer pvVar6;
  tuple<duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __p;
  __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  _Var7;
  pointer pRVar8;
  const_reference this_05;
  type this_06;
  reference this_07;
  type gstate;
  reference this_08;
  type lstate;
  reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  size_type sVar12;
  size_type __n;
  ulong uVar13;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> local_38;
  
  this_00 = &this->scanner;
  if (((this->scanner).
       super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
       .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl ==
       (RowDataCollectionScanner *)0x0) ||
     (pRVar8 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
               ::operator->(this_00), pRVar8->total_count == pRVar8->total_scanned)) {
    optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(&this->window_hash_group);
    pWVar2 = (this->window_hash_group).ptr;
    optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(&this->task);
    WindowHashGroup::GetEvaluateScanner((WindowHashGroup *)&stack0xffffffffffffffc8,(idx_t)pWVar2);
    __p.
    super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
    .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          )(_Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
            )local_38._M_head_impl;
    local_38._M_head_impl = (PartitionGlobalHashGroup *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
             *)this_00,
            (pointer)__p.
                     super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                     .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl)
    ;
    _Var7._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
    .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
         (tuple<duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          )(tuple<duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
            )local_38._M_head_impl;
    if ((__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         )local_38._M_head_impl !=
        (__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         )0x0) {
      RowDataCollectionScanner::~RowDataCollectionScanner
                ((RowDataCollectionScanner *)local_38._M_head_impl);
      operator_delete((void *)_Var7._M_t.
                              super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                              .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>.
                              _M_head_impl);
    }
    optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(&this->window_hash_group);
    iVar3 = ((this->window_hash_group).ptr)->batch_base;
    optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(&this->task);
    this->batch_index = iVar3 + ((this->task).ptr)->begin_idx;
  }
  pRVar8 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  iVar3 = pRVar8->total_scanned;
  this_01 = &this->input_chunk;
  DataChunk::Reset(this_01);
  pRVar8 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  RowDataCollectionScanner::Scan(pRVar8,this_01);
  pWVar4 = this->gsource->gsink;
  optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(&this->window_hash_group);
  pWVar2 = (this->window_hash_group).ptr;
  optional_ptr<duckdb::WindowHashGroup,_true>::CheckValid(&this->window_hash_group);
  pWVar5 = (this->window_hash_group).ptr;
  this_02 = &this->task;
  optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(this_02);
  uVar13 = ((this->task).ptr)->thread_idx;
  pvVar6 = (pWVar5->thread_states).
           super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
           .
           super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(pWVar5->thread_states).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
           -0x5555555555555555;
  if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
    ::std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13);
  }
  this_03 = &this->output_chunk;
  DataChunk::Reset(this_03);
  if ((pWVar4->executors).
      super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pWVar4->executors).
      super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_04 = &this->eval_chunk;
    __n = 0;
    do {
      this_05 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                ::operator[](&pWVar4->executors,__n);
      this_06 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                ::operator*(this_05);
      this_07 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                ::operator[](&pWVar2->gestates,__n);
      gstate = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
               ::operator*(this_07);
      this_08 = vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
                ::operator[](pvVar6 + uVar13,__n);
      lstate = unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
               ::operator*(this_08);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&this_03->data,__n);
      if ((this->eval_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->eval_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (this->eval_chunk).count = (this->input_chunk).count;
      }
      else {
        DataChunk::Reset(this_04);
        ExpressionExecutor::Execute(&this->eval_exec,this_01,this_04);
      }
      WindowExecutor::Evaluate(this_06,iVar3,this_04,pvVar9,lstate,gstate);
      __n = __n + 1;
    } while (__n < (ulong)((long)(pWVar4->executors).
                                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pWVar4->executors).
                                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  (this->output_chunk).count = (this->input_chunk).count;
  DataChunk::Verify(this_03);
  result->count = (this->input_chunk).count;
  if ((this->input_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->input_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
  }
  else {
    sVar12 = 0;
    do {
      uVar13 = sVar12 + 1;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar12);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&this_01->data,sVar12);
      Vector::Reference(pvVar9,pvVar10);
      sVar12 = uVar13;
    } while (uVar13 < (ulong)(((long)(this->input_chunk).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->input_chunk).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  if ((this->output_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->output_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar12 = 0;
    do {
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar12 + uVar13);
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&this_03->data,sVar12);
      Vector::Reference(pvVar9,pvVar10);
      sVar12 = sVar12 + 1;
    } while (sVar12 < (ulong)(((long)(this->output_chunk).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->output_chunk).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pRVar8 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  if (pRVar8->total_count == pRVar8->total_scanned) {
    optional_ptr<duckdb::WindowSourceTask,_true>::CheckValid(this_02);
    piVar1 = &this_02->ptr->begin_idx;
    *piVar1 = *piVar1 + 1;
  }
  DataChunk::Verify(result);
  return;
}

Assistant:

void WindowLocalSourceState::GetData(DataChunk &result) {
	D_ASSERT(window_hash_group->GetStage() == WindowGroupStage::GETDATA);

	if (!scanner || !scanner->Remaining()) {
		scanner = window_hash_group->GetEvaluateScanner(task->begin_idx);
		batch_index = window_hash_group->batch_base + task->begin_idx;
	}

	const auto position = scanner->Scanned();
	input_chunk.Reset();
	scanner->Scan(input_chunk);

	const auto &executors = gsource.gsink.executors;
	auto &gestates = window_hash_group->gestates;
	auto &local_states = window_hash_group->thread_states.at(task->thread_idx);
	output_chunk.Reset();
	for (idx_t expr_idx = 0; expr_idx < executors.size(); ++expr_idx) {
		auto &executor = *executors[expr_idx];
		auto &gstate = *gestates[expr_idx];
		auto &lstate = *local_states[expr_idx];
		auto &result = output_chunk.data[expr_idx];
		if (eval_chunk.data.empty()) {
			eval_chunk.SetCardinality(input_chunk);
		} else {
			eval_chunk.Reset();
			eval_exec.Execute(input_chunk, eval_chunk);
		}
		executor.Evaluate(position, eval_chunk, result, lstate, gstate);
	}
	output_chunk.SetCardinality(input_chunk);
	output_chunk.Verify();

	idx_t out_idx = 0;
	result.SetCardinality(input_chunk);
	for (idx_t col_idx = 0; col_idx < input_chunk.ColumnCount(); col_idx++) {
		result.data[out_idx++].Reference(input_chunk.data[col_idx]);
	}
	for (idx_t col_idx = 0; col_idx < output_chunk.ColumnCount(); col_idx++) {
		result.data[out_idx++].Reference(output_chunk.data[col_idx]);
	}

	// If we done with this block, move to the next one
	if (!scanner->Remaining()) {
		++task->begin_idx;
	}

	result.Verify();
}